

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nagel.c
# Opt level: O1

int main(int argc,char **argv)

{
  t_qnode *ptVar1;
  t_qnode *ptVar2;
  uint uVar3;
  uint n_frame;
  qnode_ptr_t ptVar4;
  qnode_ptr_t c;
  image512_t *pafVar5;
  long lVar6;
  ulong uVar7;
  kernel_t *pkVar8;
  undefined8 *puVar9;
  int iVar10;
  int n;
  byte bVar11;
  undefined8 auStackY_ca8 [159];
  undefined8 local_7b0 [138];
  undefined8 uStackY_360;
  int histo;
  int local_2a8;
  int local_2a4;
  int iter;
  int y;
  int x;
  uint local_294;
  int local_290;
  int vmag;
  int col;
  int row;
  int horn;
  int nbin;
  int sf;
  float maxv;
  float density;
  float std;
  float avg_err;
  float delta;
  float alpha;
  float incr;
  float trsh;
  float sigma1;
  ulong local_250;
  int binary;
  int mid_num;
  float sigma2;
  string c_fname;
  string i_fname;
  uchar hd [32];
  string h_fname;
  string v_fname;
  string out_path;
  string in_path;
  
  bVar11 = 0;
  uStackY_360 = 0x1059ed;
  valid_option(argc,argv,in_path,out_path,&sigma1,&sigma2,&histo,&sf,&trsh,i_fname,v_fname,c_fname,
               h_fname,&nbin,&incr,&mid_num,&alpha,&delta,&iter,&binary,&row,&col,&horn,&vmag,&maxv)
  ;
  puts("STAGE 1: Options Validated");
  fflush(_stdout);
  generate_gauss(&ker1,SUB84((double)sigma1,0));
  generate_gauss(&ker2,SUB84((double)sigma2,0));
  n_frame = frames(ker2.m);
  local_290 = mid_num - ((ker2.m - (ker2.m + 4 >> 0x1f)) + 4 >> 1);
  local_250 = (ulong)(uint)binary;
  if (binary == 0) {
    raster_size(i_fname,local_290,&x,&y);
  }
  else {
    binary_size(row,col,&x,&y);
  }
  ptVar4 = (qnode_ptr_t)malloc(0x170);
  ptVar4->res = 0x13c;
  ptVar4->sizx = x;
  ptVar4->sizy = y;
  ptVar4->sizz = n_frame;
  ptVar4->ofst = 0;
  ptVar4->level = 0;
  iVar10 = n_frame - ker2.m;
  local_294 = iVar10 + 1;
  c = (qnode_ptr_t)malloc(0x170);
  uVar3 = local_294;
  c->res = 0x13c;
  local_2a4 = x;
  c->sizx = x;
  local_2a8 = y;
  c->sizy = y;
  c->sizz = local_294;
  c->ofst = 0;
  c->level = 0;
  ptVar4->forth = (t_qnode *)0x0;
  ptVar4->back = (t_qnode *)0x0;
  c->forth = (t_qnode *)0x0;
  c->back = (t_qnode *)0x0;
  if (0 < (int)n_frame) {
    uVar7 = 0;
    do {
      pafVar5 = (image512_t *)malloc(0x61840);
      ptVar4->gauss_ptr[uVar7] = pafVar5;
      uVar7 = uVar7 + 1;
    } while (n_frame != uVar7);
  }
  if (-1 < iVar10) {
    uVar7 = 0;
    do {
      pafVar5 = (image512_t *)malloc(0x61840);
      c->gauss_ptr[uVar7] = pafVar5;
      uVar7 = uVar7 + 1;
    } while (uVar3 != uVar7);
  }
  puts("STAGE 2: Initializations Completed");
  fflush(_stdout);
  load_frames(i_fname,hd,local_290,n_frame,local_2a4,local_2a8,ptVar4,(int)local_250);
  puts("STAGE 3: Input Data Read");
  fflush(_stdout);
  pkVar8 = &ker1;
  puVar9 = auStackY_ca8;
  for (lVar6 = 0x9f; lVar6 != 0; lVar6 = lVar6 + -1) {
    *puVar9 = *(undefined8 *)pkVar8->k;
    pkVar8 = (kernel_t *)((long)pkVar8 + ((ulong)bVar11 * -2 + 1) * 8);
    puVar9 = puVar9 + (ulong)bVar11 * -2 + 1;
  }
  pkVar8 = &ker2;
  puVar9 = local_7b0;
  for (lVar6 = 0x9f; lVar6 != 0; lVar6 = lVar6 + -1) {
    *puVar9 = *(undefined8 *)pkVar8->k;
    pkVar8 = (kernel_t *)((long)pkVar8 + ((ulong)bVar11 * -2 + 1) * 8);
    puVar9 = puVar9 + (ulong)bVar11 * -2 + 1;
  }
  convolve(ptVar4,c,n_frame);
  puts("STAGE 4: Convolutions Completed");
  fflush(_stdout);
  if (0 < (int)n_frame) {
    uVar7 = 0;
    do {
      free(ptVar4->gauss_ptr[uVar7]);
      uVar7 = uVar7 + 1;
    } while (n_frame != uVar7);
  }
  ptVar1 = ptVar4->forth;
  ptVar2 = ptVar4->back;
  if (ptVar1 != (t_qnode *)0x0) {
    ptVar1->back = ptVar2;
  }
  if (ptVar2 != (t_qnode *)0x0) {
    ptVar2->forth = ptVar1;
  }
  free(ptVar4);
  n = (n_frame - ker2.m) + 1;
  iVar10 = c->ofst;
  ptVar4 = (qnode_ptr_t)malloc(0x170);
  ptVar4->res = 0x13c;
  ptVar4->sizx = local_2a4;
  ptVar4->sizy = local_2a8;
  ptVar4->sizz = n;
  ptVar4->ofst = iVar10;
  ptVar4->level = 0;
  ptVar4->forth = (t_qnode *)0x0;
  ptVar4->back = (t_qnode *)0x0;
  init_flow(ptVar4,n);
  C.k[0] = -1.0;
  C.k[1] = 8.0;
  C.k[2] = 0.0;
  C.k[3] = -8.0;
  C.k[4] = 1.0;
  C.f = 12.0;
  C.m = 5;
  compute_deriv(c,ptVar4,horn);
  puts("STAGE 5: Derivatives Computed");
  fflush(_stdout);
  KERNEL_Y = (int)(sigma1 * 3.0 + 1.0);
  KERNEL_X = KERNEL_Y;
  if (horn == 0) {
    nagel_relax(ptVar4,SUB84((double)alpha,0),SUB84((double)delta,0),iter,c_fname,histo);
  }
  else {
    horn_relax(ptVar4,SUB84((double)alpha,0),iter,c_fname,histo);
  }
  puts("STAGE 6: Regularization Completed");
  fflush(_stdout);
  if (sf != 0) {
    filter(ptVar4,ptVar4,SUB84((double)trsh,0));
    puts("STAGE 7: Filtering Out Completed");
    fflush(_stdout);
  }
  if (histo != 0) {
    prod_histo(ptVar4,c_fname,h_fname,nbin,SUB84((double)incr,0),&avg_err,&std,&density);
    puts("STAGE 8: Histograms Produced");
    fflush(_stdout);
  }
  if (vmag != 0) {
    screen(ptVar4,SUB84((double)maxv,0));
  }
  write_velocity(v_fname,ptVar4);
  puts("STAGE 9: Flow Written to File");
  fflush(_stdout);
  iVar10 = n_frame - ker2.m;
  if (-1 < iVar10) {
    uVar7 = 0;
    do {
      free(c->gauss_ptr[uVar7]);
      uVar7 = uVar7 + 1;
    } while (iVar10 + 1 != uVar7);
  }
  free_flow(ptVar4,(n_frame - ker2.m) + 1);
  ptVar1 = c->forth;
  ptVar2 = c->back;
  if (ptVar1 != (t_qnode *)0x0) {
    ptVar1->back = ptVar2;
  }
  if (ptVar2 != (t_qnode *)0x0) {
    ptVar2->forth = ptVar1;
  }
  free(c);
  ptVar1 = ptVar4->forth;
  ptVar2 = ptVar4->back;
  if (ptVar1 != (t_qnode *)0x0) {
    ptVar1->back = ptVar2;
  }
  if (ptVar2 != (t_qnode *)0x0) {
    ptVar2->forth = ptVar1;
  }
  free(ptVar4);
  puts("STAGE 10: End of Program\n");
  if (histo != 0) {
    printf("         Average Angular Error: %10.5f\n",SUB84((double)avg_err,0));
    printf("            Standard Deviation: %10.5f\n",SUB84((double)std,0));
    printf("                       Density: %10.5f\n",SUB84((double)density * 100.0,0));
    fflush(_stdout);
  }
  return 0;
}

Assistant:

int main(argc,argv)
int argc ;
char *argv[] ;

{ qnode_ptr_t create_node(), cub1h, cub1q, cub2h, cub2q, flh, flq,
              cub1, cub2, fl ;
  unsigned char hd[H] ;
  float sigma1, sigma2, trsh, incr, alpha, delta, avg_err, std, density,
        maxv ;
  int histo, sf, start_num, mid_num, x, y, z, nbin, iter, binary, horn,
      row, col, vmag ;
  string in_path,out_path,i_fname, v_fname, c_fname, h_fname ;

  valid_option(argc,argv,in_path,out_path,&sigma1,&sigma2,&histo,&sf,&trsh,
  i_fname,v_fname,c_fname,h_fname,&nbin,&incr,&mid_num,&alpha,&delta,&iter,
  &binary,&row,&col,&horn,&vmag,&maxv) ;
  printf("STAGE 1: Options Validated\n") ; fflush(stdout) ;
  generate_gauss(&ker1,sigma1) ;
  generate_gauss(&ker2,sigma2) ;
  z = frames(ker2.m) ;
  start_num = start_number(mid_num,ker2.m) ;
  if (!binary) {
    raster_size(i_fname,start_num,&x,&y) ;
  }
  else {
    binary_size(row,col,&x,&y) ;
  }
  init_list(&cub1h,&cub1q) ;
  init_list(&cub2h,&cub2q) ;
  init_list(&flh,&flq) ;
  cub1 = create_node(0,X,x,y,z,0) ;
  cub2 = create_node(0,X,x,y,z - ker2.m + 1,0) ;
  insert_node(cub1,&cub1h,&cub1q) ;
  insert_node(cub2,&cub2h,&cub2q) ;
  init_cube(cub1,z) ;
  init_cube(cub2,z - ker2.m + 1) ;
  printf("STAGE 2: Initializations Completed\n") ; fflush(stdout) ;
  load_frames(i_fname,hd,start_num,z,x,y,cub1,binary) ;
  printf("STAGE 3: Input Data Read\n") ; fflush(stdout) ;
  convolve(cub1,cub2,ker1,ker2,z) ;
  printf("STAGE 4: Convolutions Completed\n") ; fflush(stdout) ;
  free_cube(cub1,z) ;
  delete_node(cub1,&cub1h,&cub1q) ;
  fl = create_node(0,X,x,y,z - ker2.m + 1,cub2->ofst) ;
  insert_node(fl,&flh,&flq) ;
  init_flow(fl,z - ker2.m + 1) ;
  init_central(&C) ;
  compute_deriv(cub2,fl,horn) ;
  printf("STAGE 5: Derivatives Computed\n") ; fflush(stdout) ;
  KERNEL_X = (int)(3.0*sigma1 + 1.0) ;
  KERNEL_Y = (int)(3.0*sigma1 + 1.0) ;
  if (horn) {
    horn_relax(fl,alpha,iter,c_fname,histo) ;
  }
  else {
    nagel_relax(fl,alpha,delta,iter,c_fname,histo) ;
  }
  printf("STAGE 6: Regularization Completed\n") ; fflush(stdout) ;
  if (sf) {
    filter(fl,fl,trsh) ;
    printf("STAGE 7: Filtering Out Completed\n") ; fflush(stdout) ;
  }
  if (histo) {
    prod_histo(fl,c_fname,h_fname,nbin,incr,&avg_err,&std,&density) ;
    printf("STAGE 8: Histograms Produced\n") ; fflush(stdout) ;
  }
  if (vmag) {
    screen(fl,maxv) ;
  }
  write_velocity(v_fname,fl) ;
  printf("STAGE 9: Flow Written to File\n") ; fflush(stdout) ;
  free_cube(cub2,z - ker2.m + 1) ;
  free_flow(fl,z - ker2.m + 1) ;
  delete_node(cub2,&cub2h,&cub2q) ;
  delete_node(fl,&flh,&flq) ;
  printf("STAGE 10: End of Program\n\n") ;
  if (histo) {
    printf("         Average Angular Error: %10.5f\n", avg_err) ;
    printf("            Standard Deviation: %10.5f\n", std) ;
    printf("                       Density: %10.5f\n", density*100.0) ;
    fflush(stdout) ;
  }
}